

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  uint uVar5;
  Fault local_180;
  Fault f_1;
  undefined1 local_170 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  Reader local_118;
  uint local_e8;
  uint local_e4;
  uint i;
  WiderType<Decay<unsigned_int>,_Decay<unsigned_int>_> local_dc;
  undefined1 local_d8 [4];
  uint count;
  Reader replacementFields;
  Reader fields;
  Fault local_68;
  Fault f;
  uint32_t local_58;
  DebugExpression<unsigned_int> local_54;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  uint64_t replacementScopeId_local;
  uint64_t scopeId_local;
  Reader *replacement_local;
  Reader *structNode_local;
  CompatibilityChecker *this_local;
  
  _kjCondition._24_8_ = replacementScopeId;
  replacementScopeId_local = scopeId;
  scopeId_local = (uint64_t)replacement;
  replacement_local = structNode;
  structNode_local = (Reader *)this;
  uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount(replacement);
  uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(replacement_local);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)scopeId_local);
    uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(replacement_local);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)scopeId_local);
  uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount(replacement_local);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)scopeId_local);
    uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount(replacement_local);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement_local);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
    uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement_local);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  if ((uVar2 != 0) &&
     (uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement_local),
     uVar2 != 0)) {
    local_58 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset((Reader *)scopeId_local);
    local_54 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
    f.exception._4_4_ =
         capnp::schema::Node::Struct::Reader::getDiscriminantOffset(replacement_local);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_50,&local_54,
               (uint *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[36]>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x2f9,FAILED,
                 "replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset()",
                 "_kjCondition,\"union discriminant position changed\"",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_50,
                 (char (*) [36])"union discriminant position changed");
      this->compatibility = INCOMPATIBLE;
      kj::_::Debug::Fault::~Fault(&local_68);
      return;
    }
  }
  capnp::schema::Node::Struct::Reader::getFields
            ((Reader *)&replacementFields.reader.nestingLimit,replacement_local);
  capnp::schema::Node::Struct::Reader::getFields((Reader *)local_d8,(Reader *)scopeId_local);
  i = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                ((Reader *)&replacementFields.reader.nestingLimit);
  local_e4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_d8);
  local_dc = kj::min<unsigned_int,unsigned_int>(&i,&local_e4);
  uVar4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_d8);
  uVar5 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&replacementFields.reader.nestingLimit);
  if (uVar5 < uVar4) {
    replacementIsNewer(this);
  }
  else {
    uVar4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_d8);
    uVar5 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&replacementFields.reader.nestingLimit);
    if (uVar4 < uVar5) {
      replacementIsOlder(this);
    }
  }
  for (local_e8 = 0; local_e8 < local_dc; local_e8 = local_e8 + 1) {
    List<capnp::schema::Field,_(capnp::Kind)3>::Reader::operator[]
              (&local_118,(Reader *)&replacementFields.reader.nestingLimit,local_e8);
    List<capnp::schema::Field,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&_kjCondition_1.result,(Reader *)local_d8,local_e8);
    checkCompatibility(this,&local_118,(Reader *)&_kjCondition_1.result);
  }
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(replacement_local);
  if (bVar1) {
    bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup((Reader *)scopeId_local);
    if (bVar1) {
      f_1.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_long *)&_kjCondition.result);
      kj::_::DebugExpression<unsigned_long&>::operator==
                ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_170,
                 (DebugExpression<unsigned_long&> *)&f_1,&replacementScopeId_local);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[27]>
                  (&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x314,FAILED,"replacementScopeId == scopeId",
                   "_kjCondition,\"group node\'s scope changed\"",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_170,
                   (char (*) [27])"group node\'s scope changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_180);
      }
    }
    else {
      replacementIsOlder(this);
    }
  }
  else {
    bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup((Reader *)scopeId_local);
    if (bVar1) {
      replacementIsNewer(this);
    }
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = kj::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }